

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O3

void qTzSet(void)

{
  QBasicMutex copy;
  
  if ((AtomicType)environmentMutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
    LOCK();
    environmentMutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
    UNLOCK();
  }
  else {
    QBasicMutex::lockInternal(&environmentMutex);
  }
  tzset();
  copy = environmentMutex;
  LOCK();
  environmentMutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
  UNLOCK();
  if ((AtomicType)copy.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
    QBasicMutex::unlockInternalFutex(&environmentMutex,(void *)copy.d_ptr._q_value._M_b._M_p);
    return;
  }
  return;
}

Assistant:

void qTzSet()
{
    const auto locker = qt_scoped_lock(environmentMutex);
#if defined(Q_OS_WIN)
    _tzset();
#else
    tzset();
#endif // Q_OS_WIN
}